

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void jinit_2pass_quantizer(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_color_quantizer *pjVar3;
  _func_void_j_decompress_ptr *p_Var4;
  void *pvVar5;
  JSAMPARRAY ppJVar6;
  _func_void_j_decompress_ptr_boolean *p_Var7;
  long lVar8;
  
  pjVar3 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x58);
  cinfo->cquantize = pjVar3;
  pjVar3->start_pass = start_pass_2_quant;
  pjVar3->new_color_map = new_color_map_2_quant;
  pjVar3[2].start_pass = (_func_void_j_decompress_ptr_boolean *)0x0;
  pjVar3[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (cinfo->out_color_components != 3) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2f;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  p_Var4 = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
  pjVar3[1].finish_pass = p_Var4;
  lVar8 = 0;
  do {
    pvVar5 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x1000);
    *(void **)(pjVar3[1].finish_pass + lVar8 * 8) = pvVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  *(undefined4 *)&pjVar3[1].new_color_map = 1;
  if (cinfo->enable_2pass_quant == 0) {
    pjVar3[1].start_pass = (_func_void_j_decompress_ptr_boolean *)0x0;
  }
  else {
    JVar1 = cinfo->desired_number_of_colors;
    if ((int)JVar1 < 8) {
      *(undefined8 *)&cinfo->err->msg_code = 0x800000038;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (0x100 < (int)JVar1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x10000000039;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    ppJVar6 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar1,3);
    pjVar3[1].start_pass = (_func_void_j_decompress_ptr_boolean *)ppJVar6;
    *(JDIMENSION *)&pjVar3[1].color_quantize = JVar1;
  }
  if (cinfo->dither_mode != JDITHER_NONE) {
    cinfo->dither_mode = JDITHER_FS;
  }
  if (cinfo->dither_mode == JDITHER_FS) {
    p_Var7 = (_func_void_j_decompress_ptr_boolean *)
             (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,(ulong)(cinfo->output_width + 2) * 6);
    pjVar3[2].start_pass = p_Var7;
    init_error_limit(cinfo);
    return;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_2pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;
  int i;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_2_quant;
  cquantize->pub.new_color_map = new_color_map_2_quant;
  cquantize->fserrors = NULL;   /* flag optional arrays not allocated */
  cquantize->error_limiter = NULL;

  /* Make sure jdmaster didn't give me a case I can't handle */
  if (cinfo->out_color_components != 3)
    ERREXIT(cinfo, JERR_NOTIMPL);

  /* Allocate the histogram/inverse colormap storage */
  cquantize->histogram = (hist3d)(*cinfo->mem->alloc_small)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, HIST_C0_ELEMS * sizeof(hist2d));
  for (i = 0; i < HIST_C0_ELEMS; i++) {
    cquantize->histogram[i] = (hist2d)(*cinfo->mem->alloc_large)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof(histcell));
  }
  cquantize->needs_zeroed = TRUE; /* histogram is garbage now */

  /* Allocate storage for the completed colormap, if required.
   * We do this now since it may affect the memory manager's space
   * calculations.
   */
  if (cinfo->enable_2pass_quant) {
    /* Make sure color count is acceptable */
    int desired = cinfo->desired_number_of_colors;
    /* Lower bound on # of colors ... somewhat arbitrary as long as > 0 */
    if (desired < 8)
      ERREXIT1(cinfo, JERR_QUANT_FEW_COLORS, 8);
    /* Make sure colormap indexes can be represented by JSAMPLEs */
    if (desired > MAXNUMCOLORS)
      ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXNUMCOLORS);
    cquantize->sv_colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)desired, (JDIMENSION)3);
    cquantize->desired = desired;
  } else
    cquantize->sv_colormap = NULL;

  /* Only F-S dithering or no dithering is supported. */
  /* If user asks for ordered dither, give them F-S. */
  if (cinfo->dither_mode != JDITHER_NONE)
    cinfo->dither_mode = JDITHER_FS;

  /* Allocate Floyd-Steinberg workspace if necessary.
   * This isn't really needed until pass 2, but again it may affect the memory
   * manager's space calculations.  Although we will cope with a later change
   * in dither_mode, we do not promise to honor max_memory_to_use if
   * dither_mode changes.
   */
  if (cinfo->dither_mode == JDITHER_FS) {
    cquantize->fserrors = (FSERRPTR)(*cinfo->mem->alloc_large)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       (size_t)((cinfo->output_width + 2) * (3 * sizeof(FSERROR))));
    /* Might as well create the error-limiting table too. */
    init_error_limit(cinfo);
  }
}